

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall VolumeFile::decryptHeader(VolumeFile *this,uint8_t *header,uint64_t headerSize)

{
  bool bVar1;
  
  bVar1 = decryptData(this,header,headerSize,1);
  if (bVar1) {
    (*this->_vptr_VolumeFile[2])(this);
    if (this->m_swapEndian == false) {
      Keyset::cryptBlocksInternal<unsigned_int*,unsigned_int*,true,void>
                ((uint *)header,(uint *)(header + (headerSize & 0xfffffffffffffffc)),(uint *)header)
      ;
    }
    else {
      Keyset::cryptBlocksInternal<unsigned_int*,unsigned_int*,false,void>
                ((uint *)header,(uint *)(header + (headerSize & 0xfffffffffffffffc)),(uint *)header)
      ;
    }
  }
  return bVar1;
}

Assistant:

bool VolumeFile::decryptHeader(uint8_t* header, uint64_t headerSize) const
{
	if (!decryptData(header, headerSize, 1)) {
		return false;
	}

	const auto& keyset = getKeyset();

	auto* beg = reinterpret_cast<uint32_t*>(header);
	auto* end = beg + headerSize / sizeof(*beg);

	if (!needSwapEndian()) { // TODO: rewrite
		keyset.cryptBlocksWithSwapEndian(beg, end, beg);
	} else {
		keyset.cryptBlocks(beg, end, beg);
	}

	return true;
}